

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_triplet_to_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *paVar4;
  size_t sVar5;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  paVar4 = &source->field_2;
  for (sVar5 = 0; pixel_stride_in != sVar5; sVar5 = sVar5 + 1) {
    uVar2 = (ushort)mask;
    uVar3 = ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)(paVar4 + -1))->v2 & uVar2;
    uVar1 = paVar4->v3;
    destination[sVar5] =
         ((((triplet<unsigned_short> *)(paVar4 + -2))->field_0).v1 & uVar2) - uVar3 ^ 0x8000;
    destination[pixel_stride + sVar5] = uVar3;
    destination[pixel_stride * 2 + sVar5] = (uVar1 & uVar2) - uVar3 ^ 0x8000;
    paVar4 = paVar4 + 3;
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}